

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_list.c
# Opt level: O3

exr_result_t exr_attr_chlist_destroy(exr_context_t ctxt,exr_attr_chlist_t *clist)

{
  int iVar1;
  exr_attr_chlist_entry_t *peVar2;
  long lVar3;
  
  if (ctxt != (exr_context_t)0x0) {
    if (clist != (exr_attr_chlist_t *)0x0) {
      iVar1 = clist->num_channels;
      peVar2 = clist->entries;
      if (0 < (long)iVar1) {
        lVar3 = 0;
        do {
          if (peVar2 != (exr_attr_chlist_entry_t *)0x0) {
            if ((*(void **)(peVar2->reserved + lVar3 + -0xd) != (void *)0x0) &&
               (0 < *(int *)(peVar2->reserved + lVar3 + -0x11))) {
              (*ctxt->free_fn)(*(void **)(peVar2->reserved + lVar3 + -0xd));
            }
            *(undefined8 *)(peVar2->reserved + lVar3 + -0xd + -8) = 0;
            *(undefined8 *)(peVar2->reserved + lVar3 + -0xd) = 0;
          }
          lVar3 = lVar3 + 0x20;
        } while ((long)iVar1 * 0x20 != lVar3);
      }
      if (peVar2 != (exr_attr_chlist_entry_t *)0x0) {
        (*ctxt->free_fn)(peVar2);
      }
      clist->num_channels = 0;
      clist->num_alloced = 0;
      clist->entries = (exr_attr_chlist_entry_t *)0x0;
    }
    return 0;
  }
  return 2;
}

Assistant:

exr_result_t
exr_attr_chlist_destroy (exr_context_t ctxt, exr_attr_chlist_t* clist)
{
    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (clist)
    {
        exr_attr_chlist_t        nil = {0};
        int                      nc  = clist->num_channels;
        exr_attr_chlist_entry_t* entries =
            EXR_CONST_CAST (exr_attr_chlist_entry_t*, clist->entries);

        for (int i = 0; i < nc; ++i)
            exr_attr_string_destroy (ctxt, &(entries[i].name));
        if (entries) ctxt->free_fn (entries);
        *clist = nil;
    }
    return EXR_ERR_SUCCESS;
}